

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_nw_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  uint uVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  __m256i alVar6;
  __m256i alVar7;
  uint uVar8;
  parasail_result_t *ppVar9;
  __m256i *ptr;
  __m256i *palVar10;
  __m256i *ptr_00;
  int64_t *ptr_01;
  int iVar11;
  undefined8 uVar12;
  int iVar13;
  ulong size;
  int iVar14;
  ulong uVar15;
  long lVar16;
  __m256i *palVar17;
  long lVar18;
  __m256i *palVar19;
  int iVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar23 [32];
  
  auVar35 = in_ZMM10._0_32_;
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      parasail_nw_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_nw_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar1 = profile->s1Len;
        if ((int)uVar1 < 1) {
          parasail_nw_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_striped_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_striped_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_nw_striped_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_striped_profile_avx2_256_64_cold_1();
        }
        else {
          uVar8 = uVar1 - 1;
          size = (ulong)uVar1 + 3 >> 2;
          uVar21 = CONCAT44(0,open);
          iVar20 = -open;
          iVar14 = ppVar3->min;
          uVar15 = 0x8000000000000000 - (long)iVar14;
          if (iVar14 != iVar20 && SBORROW4(iVar14,iVar20) == iVar14 + open < 0) {
            uVar15 = uVar21 | 0x8000000000000000;
          }
          iVar14 = ppVar3->max;
          ppVar9 = parasail_result_new();
          if (ppVar9 != (parasail_result_t *)0x0) {
            iVar13 = (int)(uVar8 / size);
            ppVar9->flag = ppVar9->flag | 0x4800801;
            ptr = parasail_memalign___m256i(0x20,size);
            palVar10 = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_01 != (int64_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                (palVar10 != (__m256i *)0x0 && ptr != (__m256i *)0x0)) {
              iVar11 = s2Len + -1;
              auVar25._8_4_ = open;
              auVar25._0_8_ = uVar21;
              auVar25._12_4_ = 0;
              auVar25._16_4_ = open;
              auVar25._20_4_ = 0;
              auVar25._24_4_ = open;
              auVar25._28_4_ = 0;
              auVar26._8_4_ = gap;
              auVar26._0_8_ = CONCAT44(0,gap);
              auVar26._12_4_ = 0;
              auVar26._16_4_ = gap;
              auVar26._20_4_ = 0;
              auVar26._24_4_ = gap;
              auVar26._28_4_ = 0;
              lVar18 = uVar15 + 1;
              lVar16 = 0x7ffffffffffffffe - (long)iVar14;
              auVar22._8_8_ = lVar18;
              auVar22._0_8_ = lVar18;
              auVar23._16_8_ = lVar18;
              auVar23._0_16_ = auVar22;
              auVar23._24_8_ = lVar18;
              auVar24._8_8_ = lVar16;
              auVar24._0_8_ = lVar16;
              auVar24._16_8_ = lVar16;
              auVar24._24_8_ = lVar16;
              lVar16 = (long)iVar20;
              iVar14 = (int)size;
              auVar32._4_4_ = iVar14;
              auVar32._0_4_ = iVar14;
              auVar32._8_4_ = iVar14;
              auVar32._12_4_ = iVar14;
              auVar32._16_4_ = iVar14;
              auVar32._20_4_ = iVar14;
              auVar32._24_4_ = iVar14;
              auVar32._28_4_ = iVar14;
              auVar27._8_4_ = gap;
              auVar27._0_8_ = CONCAT44(0,gap);
              auVar27._12_4_ = 0;
              auVar27._16_4_ = gap;
              auVar27._20_4_ = 0;
              auVar27._24_4_ = gap;
              auVar27._28_4_ = 0;
              auVar29._8_8_ = lVar16;
              auVar29._0_8_ = lVar16;
              auVar29._16_8_ = lVar16;
              auVar29._24_8_ = lVar16;
              auVar32 = vpmuldq_avx2(auVar32,_DAT_00908b60);
              uVar15 = 0;
              palVar17 = ptr;
              palVar19 = ptr_00;
              do {
                auVar34._8_8_ = uVar15;
                auVar34._0_8_ = uVar15;
                auVar34._16_8_ = uVar15;
                auVar34._24_8_ = uVar15;
                auVar34 = vpaddq_avx2(auVar32,auVar34);
                auVar36 = vpmuludq_avx2(auVar34,auVar27);
                auVar34 = vpsrlq_avx2(auVar34,0x20);
                auVar34 = vpmuludq_avx2(auVar34,auVar27);
                auVar34 = vpsllq_avx2(auVar34,0x20);
                auVar34 = vpaddq_avx2(auVar36,auVar34);
                alVar6 = (__m256i)vpsubq_avx2(auVar29,auVar34);
                alVar7 = (__m256i)vpsubq_avx2((undefined1  [32])alVar6,auVar25);
                *palVar17 = alVar6;
                *palVar19 = alVar7;
                uVar15 = uVar15 + 1;
                palVar19 = palVar19 + 1;
                palVar17 = palVar17 + 1;
              } while (size != uVar15);
              *ptr_01 = 0;
              lVar16 = (ulong)(uint)s2Len - 1;
              auVar37._8_8_ = lVar16;
              auVar37._0_8_ = lVar16;
              auVar37._16_8_ = lVar16;
              auVar37._24_8_ = lVar16;
              auVar32 = vpmovsxbq_avx2(ZEXT416(0x4030201));
              uVar15 = 0;
              auVar34 = vpmovsxbq_avx2(ZEXT416(0x3020100));
              auVar36._8_8_ = 0x8000000000000000;
              auVar36._0_8_ = 0x8000000000000000;
              auVar36._16_8_ = 0x8000000000000000;
              auVar36._24_8_ = 0x8000000000000000;
              auVar35 = vpcmpeqd_avx2(auVar35,auVar35);
              auVar38._8_8_ = 4;
              auVar38._0_8_ = 4;
              auVar38._16_8_ = 4;
              auVar38._24_8_ = 4;
              do {
                auVar39._8_8_ = uVar15;
                auVar39._0_8_ = uVar15;
                auVar39._16_8_ = uVar15;
                auVar39._24_8_ = uVar15;
                auVar39 = vpor_avx2(auVar39,auVar34);
                auVar4 = vpcmpgtq_avx2(auVar39 ^ auVar36,auVar37 ^ auVar36);
                auVar39 = vpaddq_avx2(auVar35,auVar32);
                auVar5 = vpmuludq_avx2(auVar39,auVar27);
                auVar39 = vpsrlq_avx2(auVar39,0x20);
                auVar39 = vpmuludq_avx2(auVar39,auVar27);
                auVar39 = vpsllq_avx2(auVar39,0x20);
                auVar39 = vpaddq_avx2(auVar5,auVar39);
                auVar39 = vpsubq_avx2(auVar29,auVar39);
                auVar39 = vpmaskmovq_avx2(auVar4 ^ auVar35,auVar39);
                *(undefined1 (*) [32])(ptr_01 + uVar15 + 1) = auVar39;
                uVar15 = uVar15 + 4;
                auVar32 = vpaddq_avx2(auVar38,auVar32);
              } while ((s2Len + 3U & 0xfffffffc) != uVar15);
              uVar15 = 0;
              auVar28 = ZEXT3264(auVar23);
              auVar30 = ZEXT3264(auVar24);
              do {
                palVar17 = ptr;
                ptr = palVar10;
                auVar31 = SUB3216(palVar17[iVar14 - 1],0);
                auVar35._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar22;
                auVar35._16_16_ = ZEXT116(0) * auVar23._16_16_ + ZEXT116(1) * auVar31;
                auVar35 = vpalignr_avx2((undefined1  [32])palVar17[iVar14 - 1],auVar35,8);
                iVar20 = ppVar3->mapper[(byte)s2[uVar15]];
                auVar35 = vpblendd_avx2(auVar35,ZEXT832((ulong)ptr_01[uVar15]),3);
                lVar16 = 0;
                auVar33 = ZEXT3264(auVar23);
                do {
                  auVar32 = vpaddq_avx2(auVar35,*(undefined1 (*) [32])
                                                 ((long)pvVar2 + lVar16 + (long)iVar20 * size * 0x20
                                                 ));
                  auVar35 = *(undefined1 (*) [32])((long)*ptr_00 + lVar16);
                  auVar27 = vpcmpgtq_avx2(auVar32,auVar35);
                  auVar32 = vblendvpd_avx(auVar35,auVar32,auVar27);
                  auVar34 = auVar33._0_32_;
                  auVar27 = vpcmpgtq_avx2(auVar32,auVar34);
                  auVar32 = vblendvpd_avx(auVar34,auVar32,auVar27);
                  *(undefined1 (*) [32])((long)*ptr + lVar16) = auVar32;
                  auVar27 = vpcmpgtq_avx2(auVar28._0_32_,auVar32);
                  auVar27 = vblendvpd_avx(auVar32,auVar28._0_32_,auVar27);
                  auVar28 = ZEXT3264(auVar27);
                  auVar27 = vpcmpgtq_avx2(auVar32,auVar30._0_32_);
                  auVar27 = vblendvpd_avx(auVar32,auVar30._0_32_,auVar27);
                  auVar29 = vpcmpgtq_avx2(auVar35,auVar27);
                  auVar27 = vblendvpd_avx(auVar35,auVar27,auVar29);
                  auVar29 = vpcmpgtq_avx2(auVar34,auVar27);
                  auVar27 = vblendvpd_avx(auVar34,auVar27,auVar29);
                  auVar30 = ZEXT3264(auVar27);
                  auVar32 = vpsubq_avx2(auVar32,auVar25);
                  auVar27 = vpsubq_avx2(auVar35,auVar26);
                  auVar35 = vpcmpgtq_avx2(auVar27,auVar32);
                  auVar35 = vblendvpd_avx(auVar32,auVar27,auVar35);
                  *(undefined1 (*) [32])((long)*ptr_00 + lVar16) = auVar35;
                  auVar27 = vpsubq_avx2(auVar34,auVar26);
                  auVar35 = vpcmpgtq_avx2(auVar27,auVar32);
                  auVar35 = vblendvpd_avx(auVar32,auVar27,auVar35);
                  auVar33 = ZEXT3264(auVar35);
                  auVar35 = *(undefined1 (*) [32])((long)*palVar17 + lVar16);
                  lVar16 = lVar16 + 0x20;
                } while (size << 5 != lVar16);
                iVar20 = 0;
                do {
                  auVar35 = vpermpd_avx2(auVar33._0_32_,0x90);
                  auVar35 = vblendpd_avx(auVar35,ZEXT832(ptr_01[uVar15 + 1] - uVar21),1);
                  auVar33 = ZEXT3264(auVar35);
                  lVar16 = 0;
                  do {
                    auVar35 = *(undefined1 (*) [32])((long)*ptr + lVar16);
                    auVar29 = auVar33._0_32_;
                    auVar32 = vpcmpgtq_avx2(auVar35,auVar29);
                    auVar35 = vblendvpd_avx(auVar29,auVar35,auVar32);
                    *(undefined1 (*) [32])((long)*ptr + lVar16) = auVar35;
                    auVar32 = vpcmpgtq_avx2(auVar35,auVar30._0_32_);
                    auVar32 = vblendvpd_avx(auVar35,auVar30._0_32_,auVar32);
                    auVar30 = ZEXT3264(auVar32);
                    auVar27 = vpcmpgtq_avx2(auVar28._0_32_,auVar35);
                    auVar27 = vblendvpd_avx(auVar35,auVar28._0_32_,auVar27);
                    auVar28 = ZEXT3264(auVar27);
                    auVar35 = vpsubq_avx2(auVar35,auVar25);
                    auVar29 = vpsubq_avx2(auVar29,auVar26);
                    auVar33 = ZEXT3264(auVar29);
                    auVar35 = vpcmpgtq_avx2(auVar29,auVar35);
                    if ((((auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         SUB321(auVar35 >> 0x7f,0) == '\0') && SUB321(auVar35 >> 0xbf,0) == '\0') &&
                        -1 < auVar35[0x1f]) goto LAB_00772a69;
                    lVar16 = lVar16 + 0x20;
                  } while (size << 5 != lVar16);
                  iVar20 = iVar20 + 1;
                } while (iVar20 != 4);
LAB_00772a69:
                uVar15 = uVar15 + 1;
                palVar10 = palVar17;
                if (uVar15 == (uint)s2Len) {
                  alVar6 = ptr[(ulong)uVar8 % size];
                  auVar22 = alVar6._16_16_;
                  if (iVar13 < 3) {
                    iVar14 = 0;
                    do {
                      auVar35 = vperm2i128_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar6,8)
                      ;
                      alVar6 = (__m256i)vpalignr_avx2((undefined1  [32])alVar6,auVar35,8);
                      auVar22 = alVar6._16_16_;
                      iVar14 = iVar14 + 1;
                    } while (iVar14 < 3 - iVar13);
                  }
                  auVar35 = vpcmpgtq_avx2(auVar23,auVar32);
                  auVar32 = vpcmpgtq_avx2(auVar27,auVar24);
                  auVar35 = vpor_avx2(auVar32,auVar35);
                  if ((((auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       SUB321(auVar35 >> 0x7f,0) == '\0') && SUB321(auVar35 >> 0xbf,0) == '\0') &&
                      -1 < auVar35[0x1f]) {
                    uVar12 = vpextrq_avx(auVar22,1);
                    iVar14 = (int)uVar12;
                  }
                  else {
                    *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
                    iVar14 = 0;
                    iVar11 = 0;
                    uVar8 = 0;
                  }
                  ppVar9->score = iVar14;
                  ppVar9->end_query = uVar8;
                  ppVar9->end_ref = iVar11;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(palVar17);
                  parasail_free(ptr);
                  return ppVar9;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}